

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

int __thiscall blc::tools::pipe::pipe(pipe *this,int *__pipedes)

{
  undefined1 uVar1;
  undefined1 uVar2;
  int extraout_EAX;
  string *psVar3;
  mutex *pmVar4;
  undefined6 in_stack_ffffffffffffff98;
  
  stream::stream(&this->super_stream);
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_00130a20;
  std::shared_ptr<bool>::shared_ptr((shared_ptr<bool> *)0x11b0ce);
  psVar3 = getIn_abi_cxx11_((pipe *)__pipedes);
  this->_in = psVar3;
  psVar3 = getOut_abi_cxx11_((pipe *)__pipedes);
  this->_out = psVar3;
  pmVar4 = getInMut((pipe *)__pipedes);
  this->_inMut = pmVar4;
  pmVar4 = getOutMut((pipe *)__pipedes);
  this->_outMut = pmVar4;
  uVar1 = getState((pipe *)__pipedes);
  this->_master = (bool)uVar1;
  uVar2 = getBlock((pipe *)__pipedes);
  this->_block = (bool)uVar2;
  getClosed((pipe *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff98)));
  std::shared_ptr<bool>::operator=
            ((shared_ptr<bool> *)pmVar4,
             (shared_ptr<bool> *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff98)));
  std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)0x11b1b6);
  return extraout_EAX;
}

Assistant:

blc::tools::pipe::pipe(const pipe &other) {
	this->_in = const_cast<blc::tools::pipe &>(other).getIn();
	this->_out = const_cast<blc::tools::pipe &>(other).getOut();
	this->_inMut = const_cast<blc::tools::pipe &>(other).getInMut();
	this->_outMut = const_cast<blc::tools::pipe &>(other).getOutMut();
	this->_master = const_cast<blc::tools::pipe &>(other).getState();
	this->_block = const_cast<blc::tools::pipe &>(other).getBlock();
	this->_closed = const_cast<blc::tools::pipe &>(other).getClosed();
}